

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::defaultListListeners
               (ostream *out,
               vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
               *descriptions)

{
  bool bVar1;
  pointer this;
  Column *this_00;
  Column *rhs;
  Column *pCVar2;
  ostream *this_01;
  undefined8 in_RSI;
  ostream *in_RDI;
  ListenerDescription *desc;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *__range1;
  size_type maxNameLen;
  string *in_stack_fffffffffffffe78;
  Column *in_stack_fffffffffffffe80;
  Column *in_stack_fffffffffffffe88;
  vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
  *in_stack_fffffffffffffe90;
  Column local_140;
  Columns *in_stack_ffffffffffffff08;
  ostream *in_stack_ffffffffffffff10;
  string local_d0 [32];
  Column local_b0;
  reference local_58;
  ListenerDescription *local_50;
  __normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
  local_48;
  undefined8 local_40;
  ListenerDescription *local_30;
  ListenerDescription *local_28;
  __normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
  local_20;
  size_type local_18;
  undefined8 local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::operator<<(in_RDI,"Registered listeners:\n");
  bVar1 = std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::
          empty(in_stack_fffffffffffffe90);
  if (!bVar1) {
    local_28 = (ListenerDescription *)
               std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
               ::begin((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
                        *)in_stack_fffffffffffffe78);
    local_30 = (ListenerDescription *)
               std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
               ::end((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
                      *)in_stack_fffffffffffffe78);
    local_20 = std::
               max_element<__gnu_cxx::__normal_iterator<Catch::ListenerDescription_const*,std::vector<Catch::ListenerDescription,std::allocator<Catch::ListenerDescription>>>,Catch::defaultListListeners(std::ostream&,std::vector<Catch::ListenerDescription,std::allocator<Catch::ListenerDescription>>const&)::__0>
                         (local_28,local_30);
    this = __gnu_cxx::
           __normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
           ::operator->(&local_20);
    local_18 = StringRef::size(&this->name);
    local_40 = local_10;
    local_48._M_current =
         (ListenerDescription *)
         std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::begin
                   ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
                     *)in_stack_fffffffffffffe78);
    local_50 = (ListenerDescription *)
               std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
               ::end((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
                      *)in_stack_fffffffffffffe78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
                               *)in_stack_fffffffffffffe80,
                              (__normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
                               *)in_stack_fffffffffffffe78), bVar1) {
      local_58 = __gnu_cxx::
                 __normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
                 ::operator*(&local_48);
      StringRef::operator_cast_to_string((StringRef *)&stack0xffffffffffffff10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe88,(char)((ulong)in_stack_fffffffffffffe80 >> 0x38));
      TextFlow::Column::Column(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      this_00 = TextFlow::Column::indent(&local_b0,2);
      rhs = TextFlow::Column::width(this_00,local_18 + 5);
      TextFlow::Column::Column(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      pCVar2 = TextFlow::Column::initialIndent(&local_140,0);
      pCVar2 = TextFlow::Column::indent(pCVar2,2);
      in_stack_fffffffffffffe88 = TextFlow::Column::width(pCVar2,0x48 - local_18);
      TextFlow::operator+(this_00,rhs);
      in_stack_fffffffffffffe80 =
           (Column *)TextFlow::operator<<(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::operator<<((ostream *)in_stack_fffffffffffffe80,'\n');
      TextFlow::Columns::~Columns((Columns *)0x19be35);
      TextFlow::Column::~Column((Column *)0x19be3f);
      TextFlow::Column::~Column((Column *)0x19be4c);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
      __gnu_cxx::
      __normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
      ::operator++(&local_48);
    }
    this_01 = std::operator<<(local_8,'\n');
    std::ostream::operator<<(this_01,std::flush<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void defaultListListeners( std::ostream& out,
                               std::vector<ListenerDescription> const& descriptions ) {
        out << "Registered listeners:\n";

        if(descriptions.empty()) {
            return;
        }

        const auto maxNameLen =
            std::max_element( descriptions.begin(),
                              descriptions.end(),
                              []( ListenerDescription const& lhs,
                                  ListenerDescription const& rhs ) {
                                  return lhs.name.size() < rhs.name.size();
                              } )
                ->name.size();

        for ( auto const& desc : descriptions ) {
            out << TextFlow::Column( static_cast<std::string>( desc.name ) +
                                     ':' )
                           .indent( 2 )
                           .width( maxNameLen + 5 ) +
                       TextFlow::Column( desc.description )
                           .initialIndent( 0 )
                           .indent( 2 )
                           .width( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen - 8 )
                << '\n';
        }

        out << '\n' << std::flush;
    }